

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_GetPolySpots(MapData *map,TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots,
                   TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors)

{
  uint uVar1;
  FMapThing *pFVar2;
  undefined1 local_3c [8];
  FPolyStart newvert;
  FDoomEdEntry *mentry;
  uint i;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors_local;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots_local;
  MapData *map_local;
  
  for (mentry._4_4_ = 0; uVar1 = TArray<FMapThing,_FMapThing>::Size(&MapThingsConverted),
      mentry._4_4_ < uVar1; mentry._4_4_ = mentry._4_4_ + 1) {
    pFVar2 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,(ulong)mentry._4_4_);
    newvert._4_8_ = pFVar2->info;
    if (((((FDoomEdEntry *)newvert._4_8_ != (FDoomEdEntry *)0x0) &&
         (((FDoomEdEntry *)newvert._4_8_)->Type == (PClassActor *)0x0)) &&
        (10 < ((FDoomEdEntry *)newvert._4_8_)->Special)) &&
       (((FDoomEdEntry *)newvert._4_8_)->Special < 0xf)) {
      pFVar2 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,(ulong)mentry._4_4_);
      local_3c._4_4_ = FloatToFixed((pFVar2->pos).X);
      pFVar2 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,(ulong)mentry._4_4_);
      newvert.polynum = FloatToFixed((pFVar2->pos).Y);
      pFVar2 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,(ulong)mentry._4_4_);
      local_3c._0_4_ = SEXT24(pFVar2->angle);
      if (*(short *)(newvert._4_8_ + 8) == 0xb) {
        TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::Push
                  (anchors,(FPolyStart *)local_3c);
      }
      else {
        TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::Push
                  (spots,(FPolyStart *)local_3c);
      }
    }
  }
  return;
}

Assistant:

void P_GetPolySpots (MapData * map, TArray<FNodeBuilder::FPolyStart> &spots, TArray<FNodeBuilder::FPolyStart> &anchors)
{
	//if (map->HasBehavior)
	{
		for (unsigned int i = 0; i < MapThingsConverted.Size(); ++i)
		{
			FDoomEdEntry *mentry = MapThingsConverted[i].info;
			if (mentry != NULL && mentry->Type == NULL && mentry->Special >= SMT_PolyAnchor && mentry->Special <= SMT_PolySpawnHurt)
			{
				FNodeBuilder::FPolyStart newvert;
				newvert.x = FLOAT2FIXED(MapThingsConverted[i].pos.X);
				newvert.y = FLOAT2FIXED(MapThingsConverted[i].pos.Y);
				newvert.polynum = MapThingsConverted[i].angle;
				if (mentry->Special == SMT_PolyAnchor)
				{
					anchors.Push (newvert);
				}
				else
				{
					spots.Push (newvert);
				}
			}
		}
	}
}